

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrentappend.cpp
# Opt level: O1

void insert_random_elements(DuckDB *db,bool *correct,int threadnr)

{
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> _Var1;
  MaterializedQueryResult *pMVar2;
  char cVar3;
  pointer pMVar4;
  long lVar5;
  pointer *__ptr;
  long lVar6;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  Value count;
  Connection con;
  Value new_count;
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> local_108;
  MaterializedQueryResult *local_100;
  long *local_f8;
  long *local_f0;
  long *local_e8;
  long local_e0;
  bool *local_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [48];
  Connection local_90 [32];
  undefined1 *local_70 [2];
  undefined1 local_60 [48];
  
  local_e0 = (long)threadnr;
  correct[local_e0] = true;
  local_d8 = correct;
  duckdb::Connection::Connection(local_90,db);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"BEGIN TRANSACTION;","");
  duckdb::Connection::Query((string *)&local_e8);
  if (local_e8 != (long *)0x0) {
    (**(code **)(*local_e8 + 8))();
  }
  local_e8 = (long *)0x0;
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d0,"SELECT COUNT(*) FROM integers","");
  duckdb::Connection::Query((string *)&local_108);
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  pMVar4 = duckdb::
           unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                         *)&local_108);
  duckdb::MaterializedQueryResult::GetValue((ulong)local_d0,(ulong)pMVar4);
  lVar5 = duckdb::Value::GetValue<long>();
  lVar6 = 1;
  do {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"INSERT INTO integers VALUES (3)","");
    duckdb::Connection::Query((string *)&local_f0);
    if (local_f0 != (long *)0x0) {
      (**(code **)(*local_f0 + 8))();
    }
    local_f0 = (long *)0x0;
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"SELECT COUNT(*) FROM integers","");
    duckdb::Connection::Query((string *)&local_100);
    pMVar2 = local_100;
    _Var1._M_head_impl = local_108._M_head_impl;
    local_100 = (MaterializedQueryResult *)0x0;
    local_108._M_head_impl = pMVar2;
    if (_Var1._M_head_impl != (MaterializedQueryResult *)0x0) {
      (**(code **)(*(long *)_Var1._M_head_impl + 8))();
    }
    if (local_100 != (MaterializedQueryResult *)0x0) {
      (**(code **)(*(long *)local_100 + 8))();
    }
    local_100 = (MaterializedQueryResult *)0x0;
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    pMVar4 = duckdb::
             unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                           *)&local_108);
    duckdb::MaterializedQueryResult::GetValue((ulong)local_70,(ulong)pMVar4);
    local_100 = (MaterializedQueryResult *)(lVar5 + lVar6);
    cVar3 = duckdb::Value::operator!=((Value *)local_70,(long *)&local_100);
    if (cVar3 != '\0') {
      local_d8[local_e0] = false;
    }
    duckdb::Value::operator=((Value *)local_d0,(Value *)local_70);
    duckdb::Value::~Value((Value *)local_70);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x3e9);
  LOCK();
  append_finished_threads.super___atomic_base<int>._M_i =
       (__atomic_base<int>)((int)append_finished_threads.super___atomic_base<int>._M_i + 1);
  UNLOCK();
  do {
  } while (append_finished_threads.super___atomic_base<int>._M_i != 10);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"COMMIT;","");
  duckdb::Connection::Query((string *)&local_f8);
  if (local_f8 != (long *)0x0) {
    (**(code **)(*local_f8 + 8))();
  }
  local_f8 = (long *)0x0;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  duckdb::Value::~Value((Value *)local_d0);
  if (local_108._M_head_impl != (MaterializedQueryResult *)0x0) {
    (**(code **)(*(long *)local_108._M_head_impl + 8))();
  }
  duckdb::Connection::~Connection(local_90);
  return;
}

Assistant:

static void insert_random_elements(DuckDB *db, bool *correct, int threadnr) {
	correct[threadnr] = true;
	Connection con(*db);
	// initial count
	con.Query("BEGIN TRANSACTION;");
	auto result = con.Query("SELECT COUNT(*) FROM integers");
	Value count = result->GetValue(0, 0);
	auto start_count = count.GetValue<int64_t>();
	for (size_t i = 0; i < CONCURRENT_APPEND_INSERT_ELEMENTS; i++) {
		// count should increase by one for every append we do
		con.Query("INSERT INTO integers VALUES (3)");
		result = con.Query("SELECT COUNT(*) FROM integers");
		Value new_count = result->GetValue(0, 0);
		if (new_count != start_count + i + 1) {
			correct[threadnr] = false;
		}
		count = new_count;
	}
	append_finished_threads++;
	while (append_finished_threads != CONCURRENT_APPEND_THREAD_COUNT)
		;
	con.Query("COMMIT;");
}